

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

void MpiReadRequestHandler
               (CManager cm,CMConnection conn,void *msg_v,void *client_Data,attr_list attrs)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 *puVar3;
  MpiStreamWR Stream;
  long lVar4;
  int iVar5;
  void *__ptr;
  void *pvVar6;
  char *pcVar7;
  MPI_Errhandler worldErrHandler;
  undefined8 local_60;
  undefined4 *local_58;
  undefined4 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  puVar3 = *(undefined4 **)((long)msg_v + 0x28);
  Stream = *(MpiStreamWR *)(puVar3 + 6);
  (**client_Data)((Stream->Stream).CP_Stream,5,
                  "MpiReadRequestHandler:read request from reader=%d,ts=%d,off=%d,len=%d\n",
                  *(undefined4 *)((long)msg_v + 4),*(undefined8 *)((long)msg_v + 8),
                  *(undefined8 *)((long)msg_v + 0x18),*(undefined8 *)((long)msg_v + 0x10));
  if (_perfstubs_initialized == 1) {
    pvVar6 = MpiReadRequestHandler::timer;
    if (MpiReadRequestHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/dp/mpi_dp.c"
                                          ,"MpiReadRequestHandler",0x248);
      pvVar6 = (void *)ps_timer_create_(__ptr);
      MpiReadRequestHandler::timer = pvVar6;
      free(__ptr);
    }
    ps_timer_start_(pvVar6);
  }
  pcVar7 = LoadTimeStep(Stream,*(size_t *)((long)msg_v + 8));
  if (pcVar7 != (char *)0x0) {
    local_60 = 0;
    local_50 = *msg_v;
    local_48 = *(undefined4 *)((long)msg_v + 8);
    uStack_44 = *(undefined4 *)((long)msg_v + 0xc);
    uStack_40 = *(undefined4 *)((long)msg_v + 0x10);
    uStack_3c = *(undefined4 *)((long)msg_v + 0x14);
    local_38 = *(undefined8 *)((long)msg_v + 0x20);
    local_58 = puVar3 + 0x20;
    (**client_Data)((Stream->Stream).CP_Stream,5,
                    "MpiReadRequestHandler: Replying reader=%d with MPI port name=%s\n",
                    *(undefined4 *)((long)msg_v + 4));
    (**(code **)((long)client_Data + 0x10))
              ((Stream->Stream).CP_Stream,*(undefined8 *)(puVar3 + 2),
               *(undefined4 *)((long)msg_v + 4),Stream->ReadReplyFormat,&local_60);
    lVar4 = *(long *)(puVar3 + 0x1e);
    iVar2 = *(int *)((long)msg_v + 4);
    MPI_Comm_get_errhandler(&ompi_mpi_comm_world,&worldErrHandler);
    MPI_Comm_set_errhandler(&ompi_mpi_comm_world,&ompi_mpi_errors_return);
    iVar5 = MPI_Send(pcVar7 + *(long *)((long)msg_v + 0x18),*(undefined4 *)((long)msg_v + 0x10),
                     &ompi_mpi_char,0,*msg_v,*(undefined8 *)(lVar4 + (long)iVar2 * 8));
    MPI_Comm_set_errhandler(&ompi_mpi_comm_world,worldErrHandler);
    if (iVar5 != 0) {
      puVar1 = (undefined8 *)(lVar4 + (long)iVar2 * 8);
      MPI_Comm_accept(puVar3 + 0x20,&ompi_mpi_info_null,0,&ompi_mpi_comm_self,puVar1);
      (**client_Data)((Stream->Stream).CP_Stream,5,
                      "MpiReadRequestHandler: Accepted client, Link.CohortSize=%d\n",*puVar3);
      MPI_Send(pcVar7 + *(long *)((long)msg_v + 0x18),*(undefined4 *)((long)msg_v + 0x10),
               &ompi_mpi_char,0,*msg_v,*puVar1);
    }
    if (_perfstubs_initialized == 1) {
      ps_timer_stop_(MpiReadRequestHandler::timer);
    }
    return;
  }
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(MpiReadRequestHandler::timer);
  }
  (**client_Data)((Stream->Stream).CP_Stream,1,"Failed to read TimeStep %ld, not found\n",
                  *(undefined8 *)((long)msg_v + 8),*client_Data);
  return;
}

Assistant:

static void MpiReadRequestHandler(CManager cm, CMConnection conn, void *msg_v, void *client_Data,
                                  attr_list attrs)
{
    MpiReadRequestMsg ReadRequestMsg = (MpiReadRequestMsg)msg_v;
    MpiStreamWPR StreamWPR = ReadRequestMsg->StreamWPR;
    MpiStreamWR StreamWR = StreamWPR->StreamWR;
    CP_Services Svcs = (CP_Services)client_Data;

    Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                  "MpiReadRequestHandler:"
                  "read request from reader=%d,ts=%d,off=%d,len=%d\n",
                  ReadRequestMsg->RequestingRank, ReadRequestMsg->TimeStep, ReadRequestMsg->Offset,
                  ReadRequestMsg->Length);

    PERFSTUBS_TIMER_START_FUNC(timer);

    char *RequestedData = LoadTimeStep(StreamWR, ReadRequestMsg->TimeStep);

    if (!RequestedData)
    {
        PERFSTUBS_TIMER_STOP_FUNC(timer);
        Svcs->verbose(StreamWR->Stream.CP_Stream, DPCriticalVerbose,
                      "Failed to read TimeStep %ld, not found\n", ReadRequestMsg->TimeStep);
        return;
    }

    struct _MpiReadReplyMsg ReadReplyMsg = {
        .TimeStep = ReadRequestMsg->TimeStep,
        .DataLength = ReadRequestMsg->Length,
        .StreamRS = ReadRequestMsg->StreamRS,
        .NotifyCondition = ReadRequestMsg->NotifyCondition,
        .MpiPortName = StreamWPR->MpiPortName,
    };

    Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                  "MpiReadRequestHandler: Replying reader=%d with MPI port name=%s\n",
                  ReadRequestMsg->RequestingRank, StreamWPR->MpiPortName);

    Svcs->sendToPeer(StreamWR->Stream.CP_Stream, StreamWPR->Link.PeerCohort,
                     ReadRequestMsg->RequestingRank, StreamWR->ReadReplyFormat, &ReadReplyMsg);

    // Send the actual Data using MPI
    MPI_Comm *comm = &StreamWPR->CohortMpiComms[ReadRequestMsg->RequestingRank];
    MPI_Errhandler worldErrHandler;
    MPI_Comm_get_errhandler(MPI_COMM_WORLD, &worldErrHandler);
    MPI_Comm_set_errhandler(MPI_COMM_WORLD, MPI_ERRORS_RETURN);
    int ret = MPI_Send(RequestedData + ReadRequestMsg->Offset, ReadRequestMsg->Length, MPI_CHAR, 0,
                       ReadRequestMsg->NotifyCondition, *comm);
    MPI_Comm_set_errhandler(MPI_COMM_WORLD, worldErrHandler);

    if (ret != MPI_SUCCESS)
    {
        MPI_Comm_accept(StreamWPR->MpiPortName, MPI_INFO_NULL, 0, MPI_COMM_SELF, comm);
        Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                      "MpiReadRequestHandler: Accepted client, Link.CohortSize=%d\n",
                      StreamWPR->Link.CohortSize);
        MPI_Send(RequestedData + ReadRequestMsg->Offset, ReadRequestMsg->Length, MPI_CHAR, 0,
                 ReadRequestMsg->NotifyCondition, *comm);
    }

    PERFSTUBS_TIMER_STOP_FUNC(timer);
}